

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple8b.h
# Opt level: O2

void FastPForLib::Simple8b<true>::carefulunpack<15u>(uint32_t num1,uint32_t **out,uint64_t **in)

{
  ulong uVar1;
  uint32_t *puVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  bool bVar6;
  
  uVar4 = (ulong)num1;
  uVar5 = 0x2d;
  while( true ) {
    bVar6 = uVar4 == 0;
    uVar4 = uVar4 - 1;
    if (bVar6) break;
    uVar3 = uVar5 & 0x3f;
    uVar1 = **in;
    puVar2 = *out;
    uVar5 = uVar5 + 0xfffffff1;
    *out = puVar2 + 1;
    *puVar2 = (uint)(uVar1 >> uVar3) & 0x7fff;
  }
  *in = *in + 1;
  return;
}

Assistant:

static void carefulunpack(uint32_t num1, uint32_t *&out,
                            const uint64_t *&in) {
    if (log1 < 32) {
      const uint32_t actuallog1 =
          log1 < 32 ? log1 : 31; // bogus to silence compiler warnings
      const uint32_t mask = ((static_cast<uint32_t>(1) << actuallog1) - 1);
      for (uint32_t k = 0; k < num1; ++k) {
        *(out++) = static_cast<uint32_t>(
                       in[0] >> (64 - SIMPLE8B_LOGDESC - log1 - k * log1)) &
                   mask;
      }
    } else {
      for (uint32_t k = 0; k < num1; ++k) {
        *(out++) = static_cast<uint32_t>(
            in[0] >> (64 - SIMPLE8B_LOGDESC - log1 - k * log1));
      }
    }
    ++in;
  }